

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cache_interface.cpp
# Opt level: O3

bool __thiscall cppcms::cache_interface::fetch_page(cache_interface *this,string *key)

{
  base_cache *pbVar1;
  bool bVar2;
  char cVar3;
  int iVar4;
  response *prVar5;
  ostream *poVar6;
  char *__lhs;
  string tmp;
  string r_key;
  undefined1 *local_90;
  undefined8 local_88;
  undefined1 local_80 [16];
  string local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  if (((this->cache_module_).p_ == (base_cache *)0x0) || (this->context_ == (context *)0x0)) {
    cVar3 = '\0';
  }
  else {
    prVar5 = http::context::response(this->context_);
    bVar2 = http::response::need_gzip(prVar5);
    *(uint *)&this->field_0x78 = *(uint *)&this->field_0x78 & 0xfffffffe | (uint)bVar2;
    __lhs = "_U:";
    if (bVar2) {
      __lhs = "_Z:";
    }
    std::operator+(&local_50,__lhs,key);
    local_88 = 0;
    local_80[0] = 0;
    pbVar1 = (this->cache_module_).p_;
    local_90 = local_80;
    iVar4 = (**pbVar1->_vptr_base_cache)(pbVar1,&local_50,&local_90,0,0,0);
    cVar3 = (char)iVar4;
    if (cVar3 == '\0') {
      prVar5 = http::context::response(this->context_);
      http::response::copy_to_cache(prVar5);
    }
    else {
      if (bVar2) {
        prVar5 = http::context::response(this->context_);
        local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"gzip","");
        http::response::content_encoding(prVar5,&local_70);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_70._M_dataplus._M_p != &local_70.field_2) {
          operator_delete(local_70._M_dataplus._M_p);
        }
      }
      prVar5 = http::context::response(this->context_);
      poVar6 = http::response::out(prVar5);
      std::ostream::write((char *)poVar6,(long)local_90);
    }
    if (local_90 != local_80) {
      operator_delete(local_90);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != &local_50.field_2) {
      operator_delete(local_50._M_dataplus._M_p);
    }
  }
  return (bool)cVar3;
}

Assistant:

bool cache_interface::nocache()
{
	return cache_module_.get()==0;
}